

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ushort *puVar1;
  Context *context;
  OneofDescriptor *oneof;
  bool bVar2;
  byte bVar3;
  int iVar4;
  JavaType type;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar5;
  EnumDescriptor *descriptor;
  Descriptor *pDVar6;
  FieldDescriptor *pFVar7;
  ImmutableFieldLiteGenerator *pIVar8;
  reference ppVar9;
  Printer *descriptor_00;
  Printer *pPVar10;
  char *pcVar11;
  Descriptor *descriptor_01;
  ulong uVar12;
  ulong extraout_RDX;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *field;
  AlphaNum *a_02;
  int j;
  int iVar13;
  int i;
  int iVar14;
  java *this_01;
  lts_20250127 *plVar15;
  size_t sVar16;
  ImmutableMessageLiteGenerator *a0;
  int i_1;
  long lVar17;
  iterator iVar18;
  string_view begin_varname;
  string_view text;
  string_view begin_varname_00;
  string_view text_00;
  string_view varname;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view text_06;
  string_view varname_00;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view format;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view s;
  string_view s_00;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view s_01;
  string_view s_02;
  string_view text_29;
  string_view text_30;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  ImmutableMessageLiteGenerator messageGenerator;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_130;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_110;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  string local_d0;
  string builder_type;
  iterator local_90;
  Options local_80;
  
  IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&messageGenerator,(char (*) [2])0xec9c5e,(char (*) [1])(anon_var_dwarf_651463 + 5));
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&messageGenerator.name_resolver_,(char (*) [2])0xed47f7,
             (char (*) [1])(anon_var_dwarf_651463 + 5));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)&variables,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&messageGenerator,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&vars,0,(hasher *)&builder_type,(key_equal *)&vars,(allocator_type *)&local_130);
  lVar17 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&messageGenerator.super_MessageGenerator._vptr_MessageGenerator + lVar17));
    lVar17 = lVar17 + -0x30;
  } while (lVar17 != -0x20);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[7]> *)"static");
  std::__cxx11::string::assign((char *)pbVar5);
  puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  builder_type._M_dataplus._M_p = (pointer)(ulong)*puVar1;
  builder_type._M_string_length = (long)puVar1 + ~(ulong)builder_type._M_dataplus._M_p;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&messageGenerator,
             (basic_string_view<char,_std::char_traits<char>_> *)&builder_type,
             (allocator<char> *)&vars);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[10]> *)0xff9b1e);
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,
             descriptor_01);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[17]> *)"extra_interfaces");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[12]> *)"deprecation");
  std::__cxx11::string::assign((char *)pbVar5);
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  Options::Options(&local_80,&this->context_->options_);
  WriteMessageDocComment(printer,pDVar6,&local_80,false);
  Options::~Options(&local_80);
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,anon_var_dwarf_651463 + 5,(allocator<char> *)&builder_type)
  ;
  a0 = &messageGenerator;
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar6,true,(string *)a0);
  std::__cxx11::string::~string((string *)&messageGenerator);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (((this->super_MessageGenerator).descriptor_)->extension_range_count_ < 1) {
    text_23._M_str =
         "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_23._M_len = 0xd7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&variables,text_23);
    std::__cxx11::string::assign((char *)&builder_type);
  }
  else {
    text_22._M_str =
         "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_22._M_len = 0xe7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&variables,text_22);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_130,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_130._M_string_length;
    messageGenerator.super_MessageGenerator.descriptor_ = (Descriptor *)local_130._M_dataplus._M_p;
    format._M_str = (char *)&messageGenerator;
    format._M_len = (size_t)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>";
    absl::lts_20250127::Substitute_abi_cxx11_((string *)&vars,(lts_20250127 *)0x41,format,(Arg *)a0)
    ;
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&vars);
    std::__cxx11::string::~string((string *)&vars);
    std::__cxx11::string::~string((string *)&local_130);
  }
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,begin_varname,end_varname,(this->super_MessageGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateConstructor(this,printer);
  for (iVar13 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      iVar13 < pDVar6->enum_type_count_; iVar13 = iVar13 + 1) {
    descriptor = Descriptor::enum_type(pDVar6,iVar13);
    EnumLiteGenerator::EnumLiteGenerator
              ((EnumLiteGenerator *)&messageGenerator,descriptor,true,this->context_);
    EnumLiteGenerator::Generate((EnumLiteGenerator *)&messageGenerator,printer);
    EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&messageGenerator);
  }
  for (iVar13 = 0; iVar13 < pDVar6->nested_type_count_; iVar13 = iVar13 + 1) {
    pDVar6 = Descriptor::nested_type(pDVar6,iVar13);
    if ((pDVar6->options_->field_0)._impl_.map_entry_ == false) {
      pDVar6 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,iVar13);
      ImmutableMessageLiteGenerator(&messageGenerator,pDVar6,this->context_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      ~ImmutableMessageLiteGenerator(&messageGenerator);
    }
    pDVar6 = (this->super_MessageGenerator).descriptor_;
  }
  iVar13 = 0;
  for (iVar14 = 0; iVar14 < pDVar6->field_count_; iVar14 = iVar14 + 1) {
    pFVar7 = Descriptor::field(pDVar6,iVar14);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,pFVar7);
    iVar4 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar8);
    iVar13 = iVar13 + iVar4;
    pDVar6 = (this->super_MessageGenerator).descriptor_;
  }
  iVar14 = (iVar13 + 0x1f) / 0x20;
  uVar12 = (long)(iVar13 + 0x1f) % 0x20 & 0xffffffff;
  this_01 = (java *)0x0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  for (; iVar14 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_01,(int)uVar12);
    text._M_str = "private int $bit_field_name$;\n";
    text._M_len = 0x1e;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text,(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    uVar12 = extraout_RDX;
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&messageGenerator,(char (*) [2])0xec9c5e,(char (*) [1])(anon_var_dwarf_651463 + 5));
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&messageGenerator.name_resolver_,(char (*) [2])0xed47f7,
             (char (*) [1])(anon_var_dwarf_651463 + 5));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)&vars,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&messageGenerator,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&vars,0,(hasher *)&local_130,(key_equal *)&local_d0,(allocator_type *)&local_110);
  lVar17 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&messageGenerator.super_MessageGenerator._vptr_MessageGenerator + lVar17));
    lVar17 = lVar17 + -0x30;
  } while (lVar17 != -0x20);
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar18 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_110.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar18.node_;
  local_110.position_ = iVar18.position_;
  iVar18 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  local_90.node_ = iVar18.node_;
  local_90.position_ = iVar18.position_;
  while (bVar2 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator!=(&local_110,&local_90), bVar2) {
    ppVar9 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
             ::operator*(&local_110);
    oneof = ppVar9->second;
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[11]> *)0xfd8e92);
    std::__cxx11::string::_M_assign((string *)pbVar5);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[23]> *)"oneof_capitalized_name");
    std::__cxx11::string::_M_assign((string *)pbVar5);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)&messageGenerator,
               (int)(((long)oneof - (long)oneof->containing_type_->oneof_decls_) / 0x38));
    absl::lts_20250127::StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&messageGenerator,a);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[12]> *)"oneof_index");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if ((this->context_->options_).opensource_runtime == true) {
      text_24._M_str =
           "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n";
      text_24._M_len = 0x4b;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_24);
    }
    text_25._M_str = "public enum ${$$oneof_capitalized_name$Case$}$ {\n";
    text_25._M_len = 0x31;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_25);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_00,end_varname_00,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pPVar10 = printer;
    for (iVar13 = 0; iVar13 < oneof->field_count_; iVar13 = iVar13 + 1) {
      descriptor_00 = (Printer *)OneofDescriptor::field(oneof,iVar13);
      puVar1 = (ushort *)((DescriptorNames *)&(descriptor_00->sink_).buffer_)->payload_;
      plVar15 = (lts_20250127 *)(ulong)*puVar1;
      s._M_len = (long)puVar1 + ~(ulong)plVar15;
      s._M_str = (char *)pPVar10;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_130,plVar15,s);
      absl::lts_20250127::AlphaNum::AlphaNum
                ((AlphaNum *)&messageGenerator,*(int *)((long)&(descriptor_00->sink_).stream_ + 4));
      absl::lts_20250127::StrCat_abi_cxx11_(&local_d0,(lts_20250127 *)&messageGenerator,a_00);
      text_00._M_str = "$field_name$($field_number$),\n";
      text_00._M_len = 0x1e;
      io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,text_00,(char (*) [11])0x1026cd3,&local_130,(char (*) [13])0xfccc5b,
                 &local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
      varname._M_str = "field_name";
      varname._M_len = 10;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,varname,(FieldDescriptor *)descriptor_00,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      pPVar10 = descriptor_00;
    }
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[11]> *)0xfd8e92);
    s_00._M_str = (char *)pPVar10;
    s_00._M_len = (size_t)(pbVar5->_M_dataplus)._M_p;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
              ((string *)&messageGenerator,(lts_20250127 *)pbVar5->_M_string_length,s_00);
    text_01._M_str = "$cap_oneof_name$_NOT_SET(0);\n";
    text_01._M_len = 0x1d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_01,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    text_26._M_str =
         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
    ;
    text_26._M_len = 99;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_26);
    bVar3 = (this->context_->options_).opensource_runtime;
    if ((bool)bVar3 == true) {
      text_27._M_str =
           "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
      ;
      text_27._M_len = 0xb0;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_27);
      bVar3 = (this->context_->options_).opensource_runtime;
    }
    if ((bVar3 & 1) == 0) {
      text_02._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
      text_02._M_len = 0x37;
      io::Printer::Print<>(printer,text_02);
    }
    text_28._M_str =
         "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    text_28._M_len = 0x55;
    pcVar11 = 
    "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_28);
    for (iVar13 = 0; iVar13 < oneof->field_count_; iVar13 = iVar13 + 1) {
      pFVar7 = OneofDescriptor::field(oneof,iVar13);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,pFVar7->number_);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&messageGenerator,a_01);
      puVar1 = (ushort *)(pFVar7->all_names_).payload_;
      plVar15 = (lts_20250127 *)(ulong)*puVar1;
      s_01._M_len = (long)puVar1 + ~(ulong)plVar15;
      s_01._M_str = pcVar11;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_d0,plVar15,s_01);
      pcVar11 = "field_number";
      text_03._M_str = "    case $field_number$: return $field_name$;\n";
      text_03._M_len = 0x2e;
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_03,(char (*) [13])0xfccc5b,&local_130,(char (*) [11])0x1026cd3,
                 &local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
    }
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[11]> *)0xfd8e92);
    s_02._M_str = pcVar11;
    s_02._M_len = (size_t)(pbVar5->_M_dataplus)._M_p;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
              ((string *)&messageGenerator,(lts_20250127 *)pbVar5->_M_string_length,s_02);
    text_04._M_str =
         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
    ;
    text_04._M_len = 0x7d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_04,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    io::Printer::Outdent(printer);
    text_05._M_str = "};\n\n";
    text_05._M_len = 4;
    io::Printer::Print<>(printer,text_05);
    text_29._M_str =
         "@java.lang.Override\npublic $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n"
    ;
    text_29._M_len = 0xaf;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_29);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_01,end_varname_01,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_30._M_str =
         "\nprivate void ${$clear$oneof_capitalized_name$$}$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
    ;
    text_30._M_len = 0x6a;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_30);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_02,end_varname_02,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_110);
  }
  for (iVar13 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      iVar13 < pDVar6->field_count_; iVar13 = iVar13 + 1) {
    pFVar7 = Descriptor::field(pDVar6,iVar13);
    FieldConstantName_abi_cxx11_(&local_130,(java *)pFVar7,field);
    pFVar7 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar13);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,pFVar7->number_);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_d0,(lts_20250127 *)&messageGenerator,a_02);
    text_06._M_str = "public static final int $constant_name$ = $number$;\n";
    text_06._M_len = 0x34;
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,text_06,(char (*) [14])0x101d086,&local_130,(char (*) [7])0xe43eb3,&local_d0)
    ;
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    pFVar7 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar13);
    varname_00._M_str = "constant_name";
    varname_00._M_len = 0xd;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,varname_00,pFVar7,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar7 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar13);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,pFVar7);
    (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar8,printer);
    text_07._M_str = "\n";
    text_07._M_len = 1;
    io::Printer::Print<>(printer,text_07);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar2 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    text_08._M_str = "private byte memoizedIsInitialized = 2;\n";
    text_08._M_len = 0x28;
    io::Printer::Print<>(printer,text_08);
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_09._M_str =
       "@java.lang.Override\n@java.lang.SuppressWarnings({\"ThrowNull\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
  ;
  text_09._M_len = 0x142;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_09,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  text_10._M_str = "case NEW_BUILDER: {\n";
  text_10._M_len = 0x14;
  pPVar10 = printer;
  io::Printer::Print<>(printer,text_10);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateDynamicMethodNewBuilder((ImmutableMessageLiteGenerator *)pPVar10,printer);
  io::Printer::Outdent(printer);
  text_11._M_str = "}\ncase BUILD_MESSAGE_INFO: {\n";
  text_11._M_len = 0x1d;
  io::Printer::Print<>(printer,text_11);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_12._M_str =
       "}\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
  ;
  text_12._M_len = 0x1a5;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_12,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  bVar2 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  sVar16 = 0xe7;
  if (bVar2) {
    sVar16 = 0xb6;
  }
  pcVar11 = 
  "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\n// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n// So it can do anything. Combine with default case for smaller codegen.\ncase SET_MEMOIZED_IS_INITIALIZED:\n"
  ;
  if (bVar2) {
    pcVar11 = 
    "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
    ;
  }
  text_13._M_str = pcVar11;
  text_13._M_len = sVar16;
  io::Printer::Print<>(printer,text_13);
  io::Printer::Outdent(printer);
  text_14._M_str =
       "}\n// Should never happen. Generates tight code to throw an exception.\nthrow null;\n";
  text_14._M_len = 0x52;
  io::Printer::Print<>(printer,text_14);
  io::Printer::Outdent(printer);
  text_15._M_str = "}\n\n";
  text_15._M_len = 3;
  io::Printer::Print<>(printer,text_15);
  pcVar11 = (((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)(ulong)*(ushort *)(pcVar11 + 2);
  messageGenerator.super_MessageGenerator.descriptor_ =
       (Descriptor *)
       (pcVar11 + ~(ulong)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  text_16._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_16._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_16,(char (*) [10])0x10a7999,
             (basic_string_view<char,_std::char_traits<char>_> *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_17._M_str = "private static final $classname$ DEFAULT_INSTANCE;\n";
  text_17._M_len = 0x33;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_17,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)(ulong)*puVar1;
  messageGenerator.super_MessageGenerator.descriptor_ =
       (Descriptor *)
       ((long)puVar1 + ~(ulong)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  text_18._M_str =
       "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
  ;
  text_18._M_len = 0x121;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_18,(char (*) [10])0xff9b1e,
             (basic_string_view<char,_std::char_traits<char>_> *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_19._M_str =
       "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n";
  text_19._M_len = 0x4f;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_19,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  bVar2 = IsWrappersProtoFile(((this->super_MessageGenerator).descriptor_)->file_);
  if (bVar2) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&messageGenerator,this->name_resolver_,
               (this->super_MessageGenerator).descriptor_);
    pFVar7 = Descriptor::field((this->super_MessageGenerator).descriptor_,0);
    type = GetJavaType(pFVar7);
    local_130._0_16_ = PrimitiveTypeName(type);
    text_20._M_str =
         "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
    ;
    text_20._M_len = 0x65;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,text_20,(char (*) [10])0xff9b1e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator,(char (*) [11])0x105544d,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_130);
    std::__cxx11::string::~string((string *)&messageGenerator);
  }
  GenerateParser(this,printer);
  for (iVar13 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      iVar13 < pDVar6->extension_count_; iVar13 = iVar13 + 1) {
    pFVar7 = Descriptor::extension(pDVar6,iVar13);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&messageGenerator,pFVar7,this->context_);
    ImmutableExtensionLiteGenerator::Generate
              ((ImmutableExtensionLiteGenerator *)&messageGenerator,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&messageGenerator);
  }
  io::Printer::Outdent(printer);
  text_21._M_str = "}\n\n";
  text_21._M_len = 3;
  io::Printer::Print<>(printer,text_21);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vars);
  std::__cxx11::string::~string((string *)&builder_type);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&variables);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables = {{"{", ""},
                                                                   {"}", ""}};
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Annotate("{", "}", descriptor_);
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars = {{"{", ""},
                                                              {"}", ""}};
  for (auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    if (context_->options().opensource_runtime) {
      // oneofCase_ and oneof_
      printer->Print(vars,
                     "private int $oneof_name$Case_ = 0;\n"
                     "private java.lang.Object $oneof_name$_;\n");
    }
    // OneofCase enum
    printer->Print(vars, "public enum ${$$oneof_capitalized_name$Case$}$ {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     absl::AsciiStrToUpper(field->name()), "field_number",
                     absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO: Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n");
    printer->Annotate("{", "}", oneof);
    printer->Print(vars,
                   "\n"
                   "private void ${$clear$oneof_capitalized_name$$}$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"ThrowNull\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n"
        "// So it can do anything. Combine with default case for smaller "
        "codegen.\n"
        "case SET_MEMOIZED_IS_INITIALIZED:\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "// Should never happen. Generates tight code to throw an exception.\n"
      "throw null;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}